

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_blend2.cpp
# Opt level: O3

void __thiscall Prog::draw_samples(Prog *this)

{
  ALLEGRO_STATE state;
  undefined1 local_410 [1024];
  
  al_store_state(local_410,0x18);
  draw_background(0x28,0x14);
  draw_background(400,0x14);
  al_set_target_bitmap(target);
  blending_test(this,false);
  al_set_target_bitmap(target_bmp);
  blending_test(this,true);
  al_restore_state(local_410);
  al_set_blender(0,1,3);
  al_draw_bitmap(0x42200000,0x41a00000,target,0);
  al_draw_bitmap(0x43c80000,0x41a00000,target_bmp,0);
  al_restore_state(local_410);
  return;
}

Assistant:

void Prog::draw_samples()
{
   ALLEGRO_STATE state;
   al_store_state(&state, ALLEGRO_STATE_TARGET_BITMAP | ALLEGRO_STATE_BLENDER);
      
   /* Draw a background, in case our target bitmap will end up with
    * alpha in it.
    */
   draw_background(40, 20);
   draw_background(400, 20);
   
   /* Test standard blending. */
   al_set_target_bitmap(target);
   blending_test(false);

   /* Test memory blending. */
   al_set_target_bitmap(target_bmp);
   blending_test(true);

   /* Display results. */
   al_restore_state(&state);
   al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_INVERSE_ALPHA);
   al_draw_bitmap(target, 40, 20, 0);
   al_draw_bitmap(target_bmp, 400, 20, 0);
 
   al_restore_state(&state);
}